

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

size_t __thiscall
spvtools::opt::analysis::Function::ComputeExtraStateHash(Function *this,size_t hash,SeenTypes *seen)

{
  pointer ppTVar1;
  size_t sVar2;
  pointer ppTVar3;
  
  ppTVar1 = (this->param_types_).
            super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar3 = (this->param_types_).
                 super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppTVar3 != ppTVar1;
      ppTVar3 = ppTVar3 + 1) {
    hash = analysis::Type::ComputeHashValue(*ppTVar3,hash,seen);
  }
  sVar2 = analysis::Type::ComputeHashValue(this->return_type_,hash,seen);
  return sVar2;
}

Assistant:

size_t Function::ComputeExtraStateHash(size_t hash, SeenTypes* seen) const {
  for (const auto* t : param_types_) {
    hash = t->ComputeHashValue(hash, seen);
  }
  return return_type_->ComputeHashValue(hash, seen);
}